

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reliveapp.cpp
# Opt level: O1

ImU32 __thiscall relive::ReLiveApp::colorForString(ReLiveApp *this,string *str)

{
  uint32_t uVar1;
  ImU32 IVar2;
  int iVar3;
  float b;
  float g;
  float r;
  float local_3c;
  float local_38;
  float local_34;
  ImVec4 local_30;
  
  uVar1 = hash(str,this->_nameColorSeed);
  local_34 = 0.0;
  local_38 = 0.0;
  local_3c = 0.0;
  iVar3 = 0x80;
  if (this->_darkMode != false) {
    iVar3 = 0xff;
  }
  ImGui::ColorConvertHSVtoRGB
            ((float)(uVar1 & 0xff) / 255.0,0.5,(float)(int)(iVar3 - (uVar1 >> 8 & 0x1f)) / 255.0,
             &local_34,&local_38,&local_3c);
  local_30.x = local_34;
  local_30.y = local_38;
  local_30.z = local_3c;
  local_30.w = 255.0;
  IVar2 = ImGui::ColorConvertFloat4ToU32(&local_30);
  return IVar2;
}

Assistant:

ImU32 ReLiveApp::colorForString(const std::string& str)
{
    auto hash = relive::hash(str, static_cast<uint32_t>(_nameColorSeed));
    float r = 0, g = 0, b = 0;
    ImGui::ColorConvertHSVtoRGB((hash & 0xffu) / 255.0f, 0.5f, ((_darkMode ? 255 : 128) - ((hash >> 8u) & 31u)) / 255.0f, r, g, b);
    return ImGui::ColorConvertFloat4ToU32(ImVec4(r, g, b, 255));
}